

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetAppleArchs
          (cmGeneratorTarget *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *archVec)

{
  undefined8 uVar1;
  ulong uVar2;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  string local_80;
  allocator local_49;
  undefined1 local_48 [8];
  string defVarName;
  char *archs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *archVec_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  defVarName.field_2._8_8_ = 0;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_48,"OSX_ARCHITECTURES_",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    cmsys::SystemTools::UpperCase(&local_80,config);
    std::__cxx11::string::operator+=((string *)local_48,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    defVarName.field_2._8_8_ = GetProperty(this,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (defVarName.field_2._8_8_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"OSX_ARCHITECTURES",&local_a1);
    defVarName.field_2._8_8_ = GetProperty(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  uVar1 = defVarName.field_2._8_8_;
  if (defVarName.field_2._8_8_ != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,(char *)uVar1,&local_c9);
    cmSystemTools::ExpandListArgument(&local_c8,archVec,false);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAppleArchs(const std::string& config,
                             std::vector<std::string>& archVec) const
{
  const char* archs = 0;
  if(!config.empty())
    {
    std::string defVarName = "OSX_ARCHITECTURES_";
    defVarName += cmSystemTools::UpperCase(config);
    archs = this->GetProperty(defVarName);
    }
  if(!archs)
    {
    archs = this->GetProperty("OSX_ARCHITECTURES");
    }
  if(archs)
    {
    cmSystemTools::ExpandListArgument(std::string(archs), archVec);
    }
}